

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void address_space_update_topology_pass
               (AddressSpace *as,FlatView *old_view,FlatView *new_view,_Bool adding)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  _Bool _Var7;
  uint uVar8;
  QTailQLink *pQVar9;
  FlatRange *a;
  MemoryListener *pMVar10;
  FlatRange *b;
  uint uVar11;
  MemoryRegionSection mrs;
  MemoryRegionSection local_78;
  long local_38;
  
  uVar8 = 0;
  uVar11 = 0;
LAB_00cf8be5:
  local_38 = (ulong)uVar8 << 6;
  do {
    if (uVar11 < old_view->nr) {
LAB_00cf8c16:
      a = old_view->ranges + uVar11;
    }
    else {
      if (new_view->nr <= uVar8) {
        return;
      }
      if (uVar11 < old_view->nr) goto LAB_00cf8c16;
      a = (FlatRange *)0x0;
    }
    if (uVar8 < new_view->nr) {
      b = (FlatRange *)((long)&new_view->ranges->mr + local_38);
    }
    else {
      b = (FlatRange *)0x0;
    }
    if (a == (FlatRange *)0x0) break;
    if (b != (FlatRange *)0x0) {
      uVar1 = (ulong)(a->addr).start;
      lVar2 = *(long *)((long)&(a->addr).start + 8);
      uVar3 = (ulong)(b->addr).start;
      lVar4 = *(long *)((long)&(b->addr).start + 8);
      uVar6 = (ulong)(uVar1 < uVar3);
      if ((SBORROW8(lVar2,lVar4) != SBORROW8(lVar2 - lVar4,uVar6)) ==
          (long)((lVar2 - lVar4) - uVar6) < 0) {
        if (lVar2 != lVar4 || uVar1 != uVar3) break;
        _Var7 = flatrange_equal(a,b);
        if (_Var7) break;
      }
    }
    if (!adding) {
      local_78.fv = as->current_map;
      local_78.size._0_8_ = (undefined8)(a->addr).size;
      local_78.size._8_8_ = *(undefined8 *)((long)&(a->addr).size + 8);
      local_78.mr = a->mr;
      local_78.offset_within_region = a->offset_in_region;
      if (*(long *)((long)&(a->addr).start + 8) != 0) goto LAB_00cf8e2d;
      local_78.offset_within_address_space = (hwaddr)(a->addr).start;
      local_78.readonly = a->readonly;
      pQVar9 = (as->listeners).tqh_circ.tql_prev;
      while (pvVar5 = pQVar9->tql_prev->tql_next, pvVar5 != (void *)0x0) {
        if (*(code **)((long)pvVar5 + 0x18) != (code *)0x0) {
          (**(code **)((long)pvVar5 + 0x18))(pvVar5,&local_78);
        }
        pQVar9 = *(QTailQLink **)((long)pvVar5 + 0x48);
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
  if ((a != (FlatRange *)0x0) && (b != (FlatRange *)0x0)) {
    _Var7 = flatrange_equal(a,b);
    if (_Var7) {
      if (adding) {
        local_78.fv = as->current_map;
        local_78.size._0_8_ = (undefined8)(b->addr).size;
        local_78.size._8_8_ = *(undefined8 *)((long)&(b->addr).size + 8);
        local_78.mr = b->mr;
        local_78.offset_within_region = b->offset_in_region;
        if (*(long *)((long)&(b->addr).start + 8) != 0) {
LAB_00cf8e2d:
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        local_78.offset_within_address_space = (hwaddr)(b->addr).start;
        local_78.readonly = b->readonly;
        for (pMVar10 = (as->listeners).tqh_first; pMVar10 != (MemoryListener *)0x0;
            pMVar10 = (pMVar10->link_as).tqe_next) {
          if (pMVar10->region_nop != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
            (*pMVar10->region_nop)(pMVar10,&local_78);
          }
        }
      }
      uVar11 = uVar11 + 1;
      goto LAB_00cf8e12;
    }
  }
  if (adding) {
    local_78.fv = as->current_map;
    local_78.size._0_8_ = (undefined8)(b->addr).size;
    local_78.size._8_8_ = *(undefined8 *)((long)&(b->addr).size + 8);
    local_78.mr = b->mr;
    local_78.offset_within_region = b->offset_in_region;
    if (*(long *)((long)&(b->addr).start + 8) != 0) goto LAB_00cf8e2d;
    local_78.offset_within_address_space = (hwaddr)(b->addr).start;
    local_78.readonly = b->readonly;
    for (pMVar10 = (as->listeners).tqh_first; pMVar10 != (MemoryListener *)0x0;
        pMVar10 = (pMVar10->link_as).tqe_next) {
      if (pMVar10->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
        (*pMVar10->region_add)(pMVar10,&local_78);
      }
    }
  }
LAB_00cf8e12:
  uVar8 = uVar8 + 1;
  goto LAB_00cf8be5;
}

Assistant:

static void address_space_update_topology_pass(AddressSpace *as,
                                               const FlatView *old_view,
                                               const FlatView *new_view,
                                               bool adding)
{
    unsigned iold, inew;
    FlatRange *frold, *frnew;

    /* Generate a symmetric difference of the old and new memory maps.
     * Kill ranges in the old map, and instantiate ranges in the new map.
     */
    iold = inew = 0;
    while (iold < old_view->nr || inew < new_view->nr) {
        if (iold < old_view->nr) {
            frold = &old_view->ranges[iold];
        } else {
            frold = NULL;
        }
        if (inew < new_view->nr) {
            frnew = &new_view->ranges[inew];
        } else {
            frnew = NULL;
        }

        if (frold
            && (!frnew
                || int128_lt(frold->addr.start, frnew->addr.start)
                || (int128_eq(frold->addr.start, frnew->addr.start)
                    && !flatrange_equal(frold, frnew)))) {
            /* In old but not in new, or in both but attributes changed. */

            if (!adding) {
                MEMORY_LISTENER_UPDATE_REGION(frold, as, Reverse, region_del);
            }

            ++iold;
        } else if (frold && frnew && flatrange_equal(frold, frnew)) {
            /* In both and unchanged (except logging may have changed) */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_nop);
            }

            ++iold;
            ++inew;
        } else {
            /* In new */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_add);
            }

            ++inew;
        }
    }
}